

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_set_format.c
# Opt level: O3

void test_read_append_filter_wrong_program(void)

{
  wchar_t wVar1;
  int iVar2;
  archive *_a;
  archive_entry *ae;
  archive_entry *local_20;
  
  wVar1 = canRunCommand("bunzip2 -V");
  if (wVar1 != L'\0') {
    _a = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'Ó',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    wVar1 = archive_read_set_format(_a,L'\x00030000');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'Ô',(uint)(wVar1 == L'\0'),
                     "0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR)",_a);
    iVar2 = archive_read_append_filter_program(_a,"bunzip2 -q");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'Ö',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_read_append_filter_program(a, \"bunzip2 -q\")",_a);
    iVar2 = archive_read_open_memory(_a,archive,0x5d);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'Ø',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_read_open_memory(a, archive, sizeof(archive))",_a);
    iVar2 = archive_read_next_header(_a,&local_20);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'Ù',(uint)(iVar2 < -0x14),
                     "archive_read_next_header(a, &ae) < (ARCHIVE_WARN)",_a);
    iVar2 = archive_read_close(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'Ú',-0x14,"ARCHIVE_WARN",(long)iVar2,"archive_read_close(a)",_a);
    iVar2 = archive_read_free(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'Û',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                 ,L'Ð');
  test_skipping("Can\'t run bunzip2 program on this platform");
  return;
}

Assistant:

DEFINE_TEST(test_read_append_filter_wrong_program)
{
  struct archive_entry *ae;
  struct archive *a;

  /*
   * If we have "bunzip2 -q", try using that.
   */
  if (!canRunCommand("bunzip2 -V")) {
    skipping("Can't run bunzip2 program on this platform");
    return;
  }
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR));
  assertEqualIntA(a, ARCHIVE_OK,
      archive_read_append_filter_program(a, "bunzip2 -q"));
  assertEqualIntA(a, ARCHIVE_OK,
      archive_read_open_memory(a, archive, sizeof(archive)));
  assertA(archive_read_next_header(a, &ae) < (ARCHIVE_WARN));
  assertEqualIntA(a, ARCHIVE_WARN, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}